

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O2

Gia_Man_t *
Gia_ManCreateUnate(Gia_Man_t *p,Abc_Cex_t *pCex,int iFrame,int nRealPis,int fUseAllObjects)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Gia_Man_t *p_01;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  
  if ((iFrame < 0) || (pCex->iFrame < iFrame)) {
    __assert_fail("iFrame >= 0 && iFrame <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0xbc,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  p_01 = Gia_ManStart(1000);
  pcVar5 = (char *)malloc(6);
  builtin_strncpy(pcVar5,"unate",6);
  p_01->pName = pcVar5;
  Gia_ManCleanValue(p);
  if (nRealPis < 0) {
    iVar10 = 0;
    while ((iVar10 < p->nRegs &&
           (pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar10), pGVar6 != (Gia_Obj_t *)0x0))
          ) {
      if (fUseAllObjects == 0) {
        uVar2 = Gia_ManGetTwo(p,iFrame,pGVar6);
        if (1 < uVar2) {
          uVar2 = Gia_ManAppendCi(p_01);
          goto LAB_00488228;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(p_01);
        uVar3 = Gia_ManGetTwo(p,iFrame,pGVar6);
        if (1 < uVar3) {
LAB_00488228:
          pGVar6->Value = uVar2;
        }
      }
      iVar10 = iVar10 + 1;
    }
  }
  else {
    iVar10 = 0;
    while ((iVar10 < p->nRegs &&
           (pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar10), pGVar6 != (Gia_Obj_t *)0x0))
          ) {
      uVar2 = Gia_ManGetTwo(p,iFrame,pGVar6);
      pGVar6->Value = uVar2 >> 1;
      iVar10 = iVar10 + 1;
    }
  }
  Gia_ManHashAlloc(p_01);
  for (; iFrame <= pCex->iFrame; iFrame = iFrame + 1) {
    pGVar6 = p->pObjs;
    uVar2 = Gia_ManGetTwo(p,iFrame,pGVar6);
    pGVar6->Value = uVar2 >> 1;
    iVar10 = 0;
    if (nRealPis < 0) {
      while ((iVar10 < p->vCis->nSize - p->nRegs &&
             (pGVar6 = Gia_ManCi(p,iVar10), pGVar6 != (Gia_Obj_t *)0x0))) {
        uVar2 = Gia_ManGetTwo(p,iFrame,pGVar6);
        pGVar6->Value = uVar2 >> 1;
        iVar10 = iVar10 + 1;
      }
    }
    else {
      while ((iVar10 < p->vCis->nSize - p->nRegs &&
             (pGVar6 = Gia_ManCi(p,iVar10), pGVar6 != (Gia_Obj_t *)0x0))) {
        uVar2 = Gia_ManGetTwo(p,iFrame,pGVar6);
        pGVar6->Value = uVar2 >> 1;
        if (nRealPis <= iVar10) {
          if (fUseAllObjects == 0) {
            uVar2 = Gia_ManGetTwo(p,iFrame,pGVar6);
            if (1 < uVar2) {
              uVar2 = Gia_ManAppendCi(p_01);
              goto LAB_004882f1;
            }
          }
          else {
            uVar2 = Gia_ManAppendCi(p_01);
            uVar3 = Gia_ManGetTwo(p,iFrame,pGVar6);
            if (1 < uVar3) {
LAB_004882f1:
              pGVar6->Value = uVar2;
            }
          }
        }
        iVar10 = iVar10 + 1;
      }
    }
    iVar10 = 0;
    while ((iVar10 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar10), pGVar6 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        pGVar6->Value = 0;
        uVar2 = Gia_ManGetTwo(p,iFrame,pGVar6);
        if (1 < uVar2) {
          uVar2 = pGVar6[-(*(ulong *)pGVar6 >> 0x20 & 0x1fffffff)].Value;
          if (pGVar6[-(*(ulong *)pGVar6 & 0x1fffffff)].Value == 0) {
            if (uVar2 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                            ,0x11c,
                            "Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)"
                           );
            }
          }
          else {
            bVar12 = uVar2 != 0;
            uVar2 = pGVar6[-(*(ulong *)pGVar6 & 0x1fffffff)].Value;
            if (bVar12) {
              uVar4 = Gia_ManGetTwo(p,iFrame,pGVar6);
              uVar2 = pGVar6[-(*(ulong *)pGVar6 & 0x1fffffff)].Value;
              uVar3 = pGVar6[-(*(ulong *)pGVar6 >> 0x20 & 0x1fffffff)].Value;
              if ((uVar4 & 1) == 0) {
                if (uVar2 < 2) {
LAB_0048843b:
                  uVar2 = uVar3 + (uVar3 == 0);
                }
                else if (1 < uVar3) {
                  uVar2 = Gia_ManHashOr(p_01,uVar2,uVar3);
                }
              }
              else {
                if (uVar2 < 2) goto LAB_0048843b;
                if (1 < uVar3) {
                  uVar2 = Gia_ManHashAnd(p_01,uVar2,uVar3);
                }
              }
            }
          }
          pGVar6->Value = uVar2;
        }
      }
      iVar10 = iVar10 + 1;
    }
    iVar10 = 0;
    while ((iVar10 < p->vCos->nSize && (pGVar6 = Gia_ManCo(p,iVar10), pGVar6 != (Gia_Obj_t *)0x0)))
    {
      pGVar6->Value = pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value;
      iVar10 = iVar10 + 1;
    }
    if (iFrame == pCex->iFrame) break;
    iVar10 = 0;
    while (((iVar10 < p->nRegs &&
            (pGVar6 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10), pGVar6 != (Gia_Obj_t *)0x0)
            ) && (pGVar7 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar10),
                 pGVar7 != (Gia_Obj_t *)0x0))) {
      pGVar7->Value = pGVar6->Value;
      iVar10 = iVar10 + 1;
    }
  }
  Gia_ManHashStop(p_01);
  pGVar6 = Gia_ManPo(p,pCex->iPo);
  uVar2 = Gia_ManGetTwo(p,pCex->iFrame,pGVar6);
  if (uVar2 < 2) {
    __assert_fail("(Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0x128,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  uVar2 = pGVar6->Value;
  if (uVar2 == 0) {
    __assert_fail("pObj->Value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0x129,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  if ((-1 < (int)uVar2) && (uVar3 = uVar2 >> 1, (int)uVar3 < p_01->nObjs)) {
    pGVar6 = Gia_ManObj(p_01,uVar3);
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && (int)*(uint *)pGVar6 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar6 = Gia_ManAppendObj(p_01);
    pGVar6->field_0x3 = pGVar6->field_0x3 | 0x80;
    iVar10 = Gia_ObjId(p_01,pGVar6);
    uVar8 = (ulong)(iVar10 - uVar3 & 0x1fffffff);
    uVar1 = *(ulong *)pGVar6;
    uVar11 = (ulong)((uVar2 & 1) << 0x1d);
    *(ulong *)pGVar6 = uVar11 | uVar1 & 0xffffffffc0000000 | uVar8;
    *(ulong *)pGVar6 =
         uVar11 | uVar1 & 0xe0000000c0000000 | uVar8 |
         (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
    p_00 = p_01->vCos;
    iVar10 = Gia_ObjId(p_01,pGVar6);
    Vec_IntPush(p_00,iVar10);
    if (p_01->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_01,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff),pGVar6);
    }
    Gia_ObjId(p_01,pGVar6);
    pGVar9 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
    return pGVar9;
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManCreateUnate( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrame, int nRealPis, int fUseAllObjects )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, k, Value;
    assert( iFrame >= 0 && iFrame <= pCex->iFrame );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    Gia_ManCleanValue( p );
    // set flop outputs
    if ( nRealPis < 0 ) // CEX min
    {
        Gia_ManForEachRo( p, pObj, k )
        {
            if ( fUseAllObjects )
            {
                int Value = Gia_ManAppendCi(pNew);
                if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                    pObj->Value = Value;
            }
            else if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                pObj->Value = Gia_ManAppendCi(pNew);
        }
    }
    else
    {
        Gia_ManForEachRo( p, pObj, k )
            pObj->Value = (Gia_ManGetTwo(p, iFrame, pObj) >> 1);
    }
    Gia_ManHashAlloc( pNew );
    for ( f = iFrame; f <= pCex->iFrame; f++ )
    {
/*
        printf( "  F%03d ", f );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->Value > 0 );
        printf( "\n" );
*/
        // set const0 to const1 if present
        pObj = Gia_ManConst0(p);
        pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        // set primary inputs 
        if ( nRealPis < 0 ) // CEX min
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        }
        else
        {
            Gia_ManForEachPi( p, pObj, k )
            {
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
                if ( k >= nRealPis )
                {
                    if ( fUseAllObjects )
                    {
                        int Value = Gia_ManAppendCi(pNew);
                        if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                            pObj->Value = Value;
                    }
                    else if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                        pObj->Value = Gia_ManAppendCi(pNew);
                }
            }
        }
        // traverse internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        { 
            pObj->Value = 0;
            Value = Gia_ManGetTwo(p, f, pObj);
            if ( !(Value >> 1) ) // not in the path
                continue;
            if ( Gia_ObjFanin0(pObj)->Value && Gia_ObjFanin1(pObj)->Value )
            {
                if ( 1 & Gia_ManGetTwo(p, f, pObj) ) // value 1
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
                else // value 0
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
            }
            else if ( Gia_ObjFanin0(pObj)->Value )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( Gia_ObjFanin1(pObj)->Value )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
    }
    Gia_ManHashStop( pNew );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( (Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1) );
    assert( pObj->Value );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}